

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void rw::clearMatFX(MatFX *matfx)

{
  uint32 uVar1;
  int local_14;
  int i;
  MatFX *matfx_local;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    uVar1 = matfx->fx[local_14].type;
    if (uVar1 == 1) {
      if (matfx->fx[local_14].field_1.bump.bumpedTex != (Texture *)0x0) {
        Texture::destroy(matfx->fx[local_14].field_1.bump.bumpedTex);
      }
      if (matfx->fx[local_14].field_1.bump.tex != (Texture *)0x0) {
        Texture::destroy(matfx->fx[local_14].field_1.bump.tex);
      }
    }
    else if (uVar1 == 2) {
      if (matfx->fx[local_14].field_1.bump.bumpedTex != (Texture *)0x0) {
        Texture::destroy(matfx->fx[local_14].field_1.bump.bumpedTex);
      }
    }
    else if ((uVar1 == 4) && (matfx->fx[local_14].field_1.bump.frame != (Frame *)0x0)) {
      Texture::destroy(matfx->fx[local_14].field_1.dual.tex);
    }
  }
  memset(matfx,0,0x58);
  return;
}

Assistant:

static void
clearMatFX(MatFX *matfx)
{
	for(int i = 0; i < 2; i++)
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			if(matfx->fx[i].bump.bumpedTex)
				matfx->fx[i].bump.bumpedTex->destroy();
			if(matfx->fx[i].bump.tex)
				matfx->fx[i].bump.tex->destroy();
			break;

		case MatFX::ENVMAP:
			if(matfx->fx[i].env.tex)
				matfx->fx[i].env.tex->destroy();
			break;

		case MatFX::DUAL:
			if(matfx->fx[i].dual.tex)
				matfx->fx[i].dual.tex->destroy();
			break;
		}
	memset(matfx, 0, sizeof(MatFX));
}